

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline.c
# Opt level: O2

symbol_list * create_symbol_list(dmr_C *C,symbol_list *src)

{
  symbol *__src;
  symbol *__dest;
  undefined1 local_50 [8];
  ptr_list_iter symiter__;
  symbol_list *dst;
  
  symiter__.__nr = 0;
  symiter__._20_4_ = 0;
  ptrlist_forward_iterator((ptr_list_iter *)local_50,(ptr_list *)src);
  __src = (symbol *)ptrlist_iter_next((ptr_list_iter *)local_50);
  while (__src != (symbol *)0x0) {
    __dest = dmrC_alloc_symbol(C->S,__src->pos,(uint)*(byte *)__src);
    memcpy(__dest,__src,0xe8);
    (__dest->field_15).bb_target = (basic_block *)0x0;
    __dest->pseudo = (pseudo_t)0x0;
    __dest->replace = __src;
    __src->replace = __dest;
    ptrlist_add((ptr_list **)&symiter__.__nr,__dest,&C->ptrlist_allocator);
    __src = (symbol *)ptrlist_iter_next((ptr_list_iter *)local_50);
  }
  return (symbol_list *)symiter__._16_8_;
}

Assistant:

static struct symbol_list *create_symbol_list(struct dmr_C *C, struct symbol_list *src)
{
	struct symbol_list *dst = NULL;
	struct symbol *sym;

	FOR_EACH_PTR(src, sym) {
		struct symbol *newsym = create_copy_symbol(C, sym);
		dmrC_add_symbol(C, &dst, newsym);
	} END_FOR_EACH_PTR(sym);
	return dst;
}